

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O3

void __thiscall
Seismogramm<float>::SaveSegY
          (Seismogramm<float> *this,string *path,vector<float,_std::allocator<float>_> *times,
          bool save_empty_headers)

{
  pointer psVar1;
  pointer pvVar2;
  pointer pcVar3;
  ostream *poVar4;
  ulong uVar5;
  segy_bin_header_data *psVar6;
  undefined1 *puVar7;
  ulong uVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream additionalf;
  ofstream outf;
  char empty_trace_header [240];
  char empty_bin_header [400];
  char text_header [3200];
  long *local_1360 [2];
  long local_1350 [2];
  string *local_1340;
  long local_1338;
  filebuf local_1330 [24];
  byte abStack_1318 [216];
  ios_base local_1240 [264];
  long local_1138;
  filebuf local_1130 [24];
  byte abStack_1118 [216];
  ios_base local_1040 [264];
  undefined1 local_f38 [240];
  segy_bin_header_data local_e48;
  undefined1 local_cb8 [3208];
  
  local_1340 = path;
  std::ofstream::ofstream(&local_1138,(path->_M_dataplus)._M_p,_S_out|_S_bin);
  if ((abStack_1118[*(long *)(local_1138 + -0x18)] & 5) != 0) {
LAB_0010743f:
    std::operator<<((ostream *)&std::cout,"Error in writing SEG-Y file.\n");
LAB_00107467:
    exit(1);
  }
  memset(local_cb8,0,0xc80);
  memset(&local_e48,0,400);
  memset(local_f38,0,0xf0);
  std::ostream::write((char *)&local_1138,(long)local_cb8);
  swap_header_endian(this);
  psVar6 = &this->header_data;
  if (save_empty_headers) {
    psVar6 = &local_e48;
  }
  std::ostream::write((char *)&local_1138,(long)psVar6);
  swap_header_endian(this);
  swap_all_trace_headers_endian(this);
  swap_data_endian(this);
  if ((this->header_data).num_of_traces_per_record != 0) {
    lVar9 = 8;
    lVar11 = 0;
    uVar8 = 0;
    do {
      puVar7 = local_f38;
      if (!save_empty_headers) {
        psVar1 = (this->trace_header_data).
                 super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = ((long)(this->trace_header_data).
                       super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) *
                -0x1111111111111111;
        if (uVar8 <= uVar5 && uVar5 - uVar8 != 0) {
          puVar7 = (undefined1 *)((long)psVar1->other1 + lVar11 + -0x10);
          goto LAB_001071cb;
        }
LAB_0010742e:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
        goto LAB_0010743f;
      }
LAB_001071cb:
      std::ostream::write((char *)&local_1138,(long)puVar7);
      pvVar2 = (this->data).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->data).
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
              -0x5555555555555555;
      if (uVar5 < uVar8 || uVar5 - uVar8 == 0) goto LAB_0010742e;
      std::ostream::write((char *)&local_1138,*(long *)((long)pvVar2 + lVar9 + -8));
      uVar8 = uVar8 + 1;
      lVar11 = lVar11 + 0xf0;
      lVar9 = lVar9 + 0x18;
    } while (uVar8 < (this->header_data).num_of_traces_per_record);
  }
  swap_all_trace_headers_endian(this);
  swap_data_endian(this);
  std::ofstream::close();
  local_1138 = _VTT;
  uVar10 = __filebuf;
  if (save_empty_headers) {
    pcVar3 = (local_1340->_M_dataplus)._M_p;
    local_1360[0] = local_1350;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1360,pcVar3,pcVar3 + local_1340->_M_string_length);
    std::__cxx11::string::append((char *)local_1360);
    std::ofstream::ofstream(&local_1338,(char *)local_1360[0],_S_out);
    if (local_1360[0] != local_1350) {
      operator_delete(local_1360[0],local_1350[0] + 1);
    }
    if ((abStack_1318[*(long *)(local_1338 + -0x18)] & 5) != 0) {
      std::operator<<((ostream *)&std::cout,"Error in writing SEG-Y file(additional info).\n");
      goto LAB_00107467;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1338,"Number of traces = ",0x13);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1338);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1338,"Number of samples = ",0x14);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1338);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1338,"Time step(in ms.) = ",0x14);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1338);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ofstream::close();
    uVar10 = __filebuf;
    lVar9 = _VTT;
    local_1338 = _VTT;
    *(undefined8 *)(local_1330 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_1330);
    std::ios_base::~ios_base(local_1240);
    local_1138 = lVar9;
  }
  *(undefined8 *)(local_1130 + *(long *)(local_1138 + -0x18) + -8) = uVar10;
  std::filebuf::~filebuf(local_1130);
  std::ios_base::~ios_base(local_1040);
  return;
}

Assistant:

void Seismogramm<Scalar>::SaveSegY(const std::string& path, const std::vector<Scalar>& times, bool save_empty_headers)
{
    std::ofstream outf (path.data(), std::ios::out | std::ios::binary);
    if (!outf)
    {
        std::cout << "Error in writing SEG-Y file.\n";
        std::exit(1);
    }

    char text_header[3200];
    for (int i = 0; i < 3200; i++)
        text_header[i] = 0;

    char empty_bin_header[sizeof(segy_bin_header_data)];
    for (int i = 0; i < sizeof(segy_bin_header_data); i++)
        empty_bin_header[i] = 0;

    char empty_trace_header[sizeof(segy_trace_header)];
    for (int i = 0; i < sizeof(segy_trace_header); i++)
        empty_trace_header[i] = 0;

    outf.write(text_header, 3200);




    // Saving Binary Header
    swap_header_endian();
    if (save_empty_headers)
        outf.write(reinterpret_cast<char*>(&empty_bin_header), sizeof(empty_bin_header));
    else
        outf.write(reinterpret_cast<char*>(&header_data), sizeof(header_data));
    swap_header_endian();

    // Saving Data and Trace Headers
    swap_all_trace_headers_endian();
    swap_data_endian();
    for (uint32 i = 0; i <  header_data.num_of_traces_per_record; i++)
    {
        if (save_empty_headers)
            outf.write(reinterpret_cast<char*>(&empty_trace_header), sizeof(empty_trace_header));
        else
            outf.write(reinterpret_cast<char*>(&trace_header_data.at(i)), sizeof(trace_header_data.at(i)));

        outf.write(reinterpret_cast<char*>(data.at(i).data()), sizeof(float) * data.at(i).size());
    }
    swap_all_trace_headers_endian();
    swap_data_endian();

    outf.close();

    // saving the most important additional info if headers are set to 0
    if (save_empty_headers)
    {
        std::ofstream additionalf ((path + ".info.txt").data(), std::ios::out);
        if (!additionalf)
        {
            std::cout << "Error in writing SEG-Y file(additional info).\n";
            std::exit(1);
        }
        additionalf << "Number of traces = " <<  header_data.num_of_traces_per_record << std::endl;
        additionalf << "Number of samples = " <<  header_data.samples_per_trace << std::endl;
        additionalf << "Time step(in ms.) = " <<  header_data.sample_interval << std::endl;
        additionalf.close();
    }
}